

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

MIR_insn_t_conflict create_label(MIR_context_t ctx,int64_t label_num)

{
  MIR_insn_t_conflict pMVar1;
  
  pMVar1 = create_insn(ctx,1,MIR_LABEL);
  pMVar1->ops[0].data = (void *)0x0;
  *(undefined2 *)&pMVar1->ops[0].field_0x8 = 3;
  pMVar1->ops[0].u.i = label_num;
  *(undefined4 *)&pMVar1->field_0x1c = 0;
  return pMVar1;
}

Assistant:

static MIR_insn_t create_label (MIR_context_t ctx, int64_t label_num) {
  MIR_insn_t insn = new_insn1 (ctx, MIR_LABEL);

  insn->ops[0] = MIR_new_int_op (ctx, label_num);
  insn->nops = 0;
  return insn;
}